

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack28_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  uVar1 = *in;
  auVar10 = *(undefined1 (*) [16])(in + 1);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x2010004));
  auVar11 = *(undefined1 (*) [16])(in + 8);
  uVar2 = in[7];
  uVar3 = *(ulong *)(in + 0xc);
  auVar15._8_8_ = 0x80000000c;
  auVar15._0_8_ = 0x80000000c;
  *out = uVar1 & 0xfffffff;
  uVar4 = *(ulong *)(in + 5);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar4;
  auVar5 = vpalignr_avx(auVar13,auVar10,0xc);
  auVar8 = vpermt2d_avx512vl(auVar10,auVar6,ZEXT416(uVar1));
  auVar12 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  auVar9 = vpermi2d_avx512vl(auVar6,auVar11,ZEXT416(uVar2));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar3;
  auVar6 = vpalignr_avx(auVar14,auVar11,0xc);
  auVar7 = vpsrlvd_avx2(auVar5,auVar15);
  auVar10 = vpshldvd_avx512_vbmi2(auVar10,auVar8,auVar12);
  auVar11 = vpshldvd_avx512_vbmi2(auVar11,auVar9,auVar12);
  auVar12._8_8_ = 0x1800000014;
  auVar12._0_8_ = 0x1800000014;
  auVar8._8_4_ = 0xfffffff;
  auVar8._0_8_ = 0xfffffff0fffffff;
  auVar8._12_4_ = 0xfffffff;
  auVar5 = vpsllvd_avx2(auVar13,auVar12);
  auVar9._8_8_ = 0xf0000000ff00000;
  auVar9._0_8_ = 0xf0000000ff00000;
  auVar10 = vpand_avx(auVar10,auVar8);
  auVar12 = vpsllvd_avx2(auVar14,auVar12);
  auVar11 = vpand_avx(auVar11,auVar8);
  *(undefined1 (*) [16])(out + 1) = auVar10;
  auVar10 = vpternlogd_avx512vl(auVar5,auVar7,auVar9,0xec);
  *(long *)(out + 5) = auVar10._0_8_;
  auVar10 = vpsrlvd_avx2(auVar6,auVar15);
  out[7] = (uint)(uVar4 >> 0x24);
  out[8] = uVar2 & 0xfffffff;
  *(undefined1 (*) [16])(out + 9) = auVar11;
  auVar10 = vpternlogd_avx512vl(auVar12,auVar10,auVar9,0xec);
  *(long *)(out + 0xd) = auVar10._0_8_;
  out[0xf] = (uint)(uVar3 >> 0x24);
  return in + 0xe;
}

Assistant:

const uint32_t *__fastunpack28_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;

  return in;
}